

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa_hotplug.c
# Opt level: O1

int device_list_size(void)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  char *__s;
  int iVar7;
  void *__s_00;
  undefined8 uStack_80;
  char local_78 [8];
  char name [32];
  int local_44;
  undefined8 uStack_40;
  int dev;
  snd_ctl_t *handle;
  int card;
  
  uStack_80 = 0x115d05;
  lVar5 = snd_ctl_card_info_sizeof();
  lVar5 = -(lVar5 + 0xfU & 0xfffffffffffffff0);
  __s = local_78 + lVar5;
  *(undefined8 *)((long)&uStack_80 + lVar5) = 0x115d1b;
  sVar6 = snd_ctl_card_info_sizeof();
  *(undefined8 *)((long)&uStack_80 + lVar5) = 0x115d2f;
  memset(__s,0,sVar6);
  *(undefined8 *)((long)&uStack_80 + lVar5) = 0x115d34;
  lVar5 = snd_pcm_info_sizeof();
  __s_00 = __s + -(lVar5 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)__s_00 + -8) = 0x115d4a;
  sVar6 = snd_pcm_info_sizeof();
  *(undefined8 *)((long)__s_00 + -8) = 0x115d57;
  memset(__s_00,0,sVar6);
  handle._4_4_ = -1;
  *(undefined8 *)((long)__s_00 + -8) = 0x115d66;
  iVar2 = snd_card_next();
  iVar7 = 0;
  if ((-1 < iVar2) && (iVar7 = 0, -1 < handle._4_4_)) {
    iVar7 = 0;
    do {
      if (handle._4_4_ < 0) {
        return iVar7;
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x115d9b;
      sprintf(local_78,"hw:%d");
      *(undefined8 *)((long)__s_00 + -8) = 0x115da9;
      iVar2 = snd_ctl_open(&stack0xffffffffffffffc0,local_78,0);
      uVar1 = uStack_40;
      if (-1 < iVar2) {
        *(undefined8 *)((long)__s_00 + -8) = 0x115dbe;
        iVar2 = snd_ctl_card_info(uVar1,__s);
        if (-1 < iVar2) {
          local_44 = -1;
          do {
            uVar1 = uStack_40;
            *(undefined8 *)((long)__s_00 + -8) = 0x115dda;
            snd_ctl_pcm_next_device(uVar1,&local_44);
            iVar2 = local_44;
            if (-1 < local_44) {
              *(undefined8 *)((long)__s_00 + -8) = 0x115deb;
              snd_pcm_info_set_device(__s_00,iVar2);
              *(undefined8 *)((long)__s_00 + -8) = 0x115df5;
              snd_pcm_info_set_subdevice(__s_00,0);
              *(undefined8 *)((long)__s_00 + -8) = 0x115e02;
              snd_pcm_info_set_stream(__s_00,1);
              uVar1 = uStack_40;
              *(undefined8 *)((long)__s_00 + -8) = 0x115e0e;
              uVar3 = snd_ctl_pcm_info(uVar1,__s_00);
              *(undefined8 *)((long)__s_00 + -8) = 0x115e1b;
              snd_pcm_info_set_stream(__s_00,0);
              uVar1 = uStack_40;
              *(undefined8 *)((long)__s_00 + -8) = 0x115e27;
              uVar4 = snd_ctl_pcm_info(uVar1,__s_00);
              if (-1 < (int)uVar4) {
                *(undefined8 *)((long)__s_00 + -8) = 0x115e36;
                snd_pcm_info_get_subdevices_count(__s_00);
              }
              iVar7 = iVar7 - ((int)~(uVar4 & uVar3) >> 0x1f);
            }
          } while (-1 < iVar2);
        }
        uVar1 = uStack_40;
        *(undefined8 *)((long)__s_00 + -8) = 0x115e50;
        snd_ctl_close(uVar1);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x115e59;
      iVar2 = snd_card_next((long)&handle + 4);
    } while (-1 < iVar2);
  }
  return iVar7;
}

Assistant:

static int device_list_size(void)
{
  snd_ctl_t *handle;
  int card, err, dev, idx;
  int nb = 0;
  snd_ctl_card_info_t *info;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&info);
  snd_pcm_info_alloca(&pcminfo);

  card = -1;
  if (snd_card_next(&card) < 0 || card < 0)
  {
    return nb;
  }

  while (card >= 0)
  {
    char name[32];

    sprintf(name, "hw:%d", card);
    if ((err = snd_ctl_open(&handle, name, 0)) < 0)
    {
      goto next_card;
    }
    if ((err = snd_ctl_card_info(handle, info)) < 0)
    {
      snd_ctl_close(handle);
      goto next_card;
    }
    dev = -1;
    while (1)
    {
      unsigned int count;
      int hasPlayback = 0;
      int hasCapture = 0;

      snd_ctl_pcm_next_device(handle, &dev);

      if (dev < 0)
        break;
      snd_pcm_info_set_device(pcminfo, dev);
      snd_pcm_info_set_subdevice(pcminfo, 0);
      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_CAPTURE);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasCapture = 1;
      }

      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_PLAYBACK);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasPlayback = 1;

        count = snd_pcm_info_get_subdevices_count(pcminfo);
      }

      if(hasPlayback == 0 && hasCapture == 0)
        continue;

      nb++;
    }
    snd_ctl_close(handle);
next_card:
    if (snd_card_next(&card) < 0)
    {
      break;
    }
  }
  return nb;
}